

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

int cmsysProcess_WaitForData(cmsysProcess *cp,char **data,int *length,double *userTimeout)

{
  fd_set *__readfds;
  double dVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  __pid_t _Var7;
  int iVar8;
  timeval *__timeout;
  ssize_t sVar9;
  int *piVar10;
  __time_t _Var11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  timeval *ptVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  double dVar21;
  timespec current_timespec;
  sigset_t old_mask;
  long local_1a8;
  double *local_1a0;
  ulong local_190;
  long local_188;
  timeval local_140;
  sigset_t local_130;
  sigset_t local_b0;
  
  if (cp == (cmsysProcess *)0x0) {
    return 0;
  }
  if (cp->State != 3) {
    return 0;
  }
  if (cp->Killed != 0) {
    return 0;
  }
  if (cp->TimeoutExpired != 0) {
    return 0;
  }
  if (userTimeout == (double *)0x0) {
    local_188 = 0;
    local_190 = 0;
  }
  else {
    clock_gettime(1,(timespec *)&local_130);
    local_190 = local_130.__val[0];
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_130.__val[1]),8);
    local_188 = (lVar15 >> 7) - (lVar15 >> 0x3f);
  }
  dVar1 = cp->Timeout;
  if ((0.0 < dVar1) && ((cp->TimeoutTime).tv_sec < 0)) {
    lVar13 = (long)((dVar1 - (double)(long)dVar1) * 1000000.0);
    lVar19 = (cp->StartTime).tv_usec;
    lVar15 = lVar19 + lVar13;
    lVar19 = lVar19 + -1000000 + lVar13;
    if (lVar15 < 1000000) {
      lVar19 = lVar15;
    }
    (cp->TimeoutTime).tv_sec = (ulong)(999999 < lVar15) + (long)dVar1 + (cp->StartTime).tv_sec;
    (cp->TimeoutTime).tv_usec = lVar19;
  }
  lVar15 = (cp->TimeoutTime).tv_sec;
  lVar19 = (cp->TimeoutTime).tv_usec;
  if (userTimeout == (double *)0x0) {
    local_1a0 = (double *)0x0;
    bVar4 = false;
    lVar13 = lVar15;
    local_1a8 = lVar19;
  }
  else {
    clock_gettime(1,(timespec *)&local_130);
    lVar14 = (long)*userTimeout;
    lVar16 = (long)((*userTimeout - (double)lVar14) * 1000000.0);
    lVar13 = (long)local_130.__val[1] / 1000 + lVar16;
    local_1a8 = lVar16 + -1000000 + (long)local_130.__val[1] / 1000;
    if (lVar13 < 1000000) {
      local_1a8 = lVar13;
    }
    lVar13 = (ulong)(999999 < lVar13) + lVar14 + local_130.__val[0];
    if (-1 < lVar15) {
      if ((lVar15 <= lVar13) && (lVar13 != lVar15 || lVar19 <= local_1a8)) {
        local_1a0 = (double *)0x0;
        bVar4 = false;
        lVar13 = lVar15;
        local_1a8 = lVar19;
        goto LAB_005c70f5;
      }
    }
    bVar4 = true;
    local_1a0 = userTimeout;
  }
LAB_005c70f5:
  ptVar17 = (timeval *)0x0;
  __readfds = &cp->PipeSet;
  __timeout = &local_140;
  if (lVar13 < 0) {
    __timeout = ptVar17;
  }
  bVar3 = false;
  do {
    iVar8 = (int)ptVar17;
    if (cp->PipesLeft < 1) break;
    lVar15 = 0;
    do {
      uVar18 = cp->PipeReadEnds[lVar15];
      bVar5 = bVar3;
      if (-1 < (int)uVar18) {
        if (((ulong)__readfds->fds_bits[uVar18 >> 6] >> ((ulong)uVar18 & 0x3f) & 1) != 0) {
          __readfds->fds_bits[uVar18 >> 6] =
               __readfds->fds_bits[uVar18 >> 6] & ~(1L << ((byte)uVar18 & 0x3f));
          do {
            sVar9 = read(cp->PipeReadEnds[lVar15],cp->PipeBuffer,0x400);
            if (-1 < sVar9) break;
            piVar10 = __errno_location();
          } while (*piVar10 == 4);
          if (sVar9 < 1) {
            if ((-1 < sVar9) || (piVar10 = __errno_location(), *piVar10 != 0xb)) {
              kwsysProcessCleanupDescriptor(cp->PipeReadEnds + lVar15);
              cp->PipesLeft = cp->PipesLeft + -1;
            }
          }
          else if (lVar15 == 2) {
            sigemptyset(&local_130);
            sigaddset(&local_130,2);
            sigaddset(&local_130,0xf);
            iVar6 = sigprocmask(0,&local_130,&local_b0);
            if (-1 < iVar6) {
              if (0 < cp->NumberOfCommands) {
                lVar19 = 0;
                do {
                  if (cp->ForkPIDs[lVar19] != 0) {
                    do {
                      _Var7 = waitpid(cp->ForkPIDs[lVar19],cp->CommandExitCodes + lVar19,1);
                      if (-1 < _Var7) break;
                      piVar10 = __errno_location();
                    } while (*piVar10 == 4);
                    if (_Var7 < 1) {
                      if ((_Var7 < 0) && (cp->State != 1)) {
                        piVar10 = __errno_location();
                        pcVar12 = strerror(*piVar10);
                        strncpy(cp->ErrorMessage,pcVar12,0x400);
                        cp->State = 1;
                      }
                    }
                    else {
                      cp->ForkPIDs[lVar19] = 0;
                      piVar10 = &cp->CommandsLeft;
                      *piVar10 = *piVar10 + -1;
                      if (*piVar10 == 0) {
                        kwsysProcessCleanupDescriptor(&cp->SignalPipe);
                      }
                    }
                  }
                  lVar19 = lVar19 + 1;
                } while (lVar19 < cp->NumberOfCommands);
              }
              sigprocmask(2,&local_b0,(sigset_t *)0x0);
            }
          }
          else if (length != (int *)0x0 && data != (char **)0x0) {
            *data = cp->PipeBuffer;
            *length = (int)sVar9;
            bVar20 = true;
            if ((int)lVar15 == 1) {
              ptVar17 = (timeval *)0x3;
            }
            else if ((int)lVar15 == 0) {
              ptVar17 = (timeval *)0x2;
            }
            goto LAB_005c734c;
          }
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    bVar20 = true;
    if (iVar8 == 0) {
      (cp->PipeSet).fds_bits[0xe] = 0;
      (cp->PipeSet).fds_bits[0xf] = 0;
      (cp->PipeSet).fds_bits[0xc] = 0;
      (cp->PipeSet).fds_bits[0xd] = 0;
      (cp->PipeSet).fds_bits[10] = 0;
      (cp->PipeSet).fds_bits[0xb] = 0;
      (cp->PipeSet).fds_bits[8] = 0;
      (cp->PipeSet).fds_bits[9] = 0;
      (cp->PipeSet).fds_bits[6] = 0;
      (cp->PipeSet).fds_bits[7] = 0;
      (cp->PipeSet).fds_bits[4] = 0;
      (cp->PipeSet).fds_bits[5] = 0;
      (cp->PipeSet).fds_bits[2] = 0;
      (cp->PipeSet).fds_bits[3] = 0;
      __readfds->fds_bits[0] = 0;
      (cp->PipeSet).fds_bits[1] = 0;
      _Var11 = local_140.tv_sec;
      lVar15 = local_140.tv_usec;
      if (-1 < lVar13) {
        clock_gettime(1,(timespec *)&local_130);
        lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_130.__val[1]),8);
        lVar15 = (lVar15 >> 7) - (lVar15 >> 0x3f);
        lVar19 = lVar15 + local_1a8;
        _Var11 = (lVar19 >> 0x3f) + (lVar13 - local_130.__val[0]);
        lVar15 = local_1a8 + 1000000 + lVar15;
        if (-1 < lVar19) {
          lVar15 = lVar19;
        }
        if (((local_1a0 != (double *)0x0) && (_Var11 < 0)) && (*local_1a0 <= 0.0)) {
          lVar15 = 0;
          _Var11 = 0;
        }
        if (_Var11 < 0) {
          bVar20 = true;
          bVar5 = true;
          goto LAB_005c734c;
        }
      }
      local_140.tv_usec = lVar15;
      local_140.tv_sec = _Var11;
      uVar18 = 0xffffffff;
      lVar15 = 3;
      do {
        uVar2 = cp->PipeReadEnds[lVar15 + -3];
        if ((-1 < (int)uVar2) &&
           (__readfds->fds_bits[uVar2 >> 6] =
                 __readfds->fds_bits[uVar2 >> 6] | 1L << ((byte)uVar2 & 0x3f),
           (int)uVar18 < (int)uVar2)) {
          uVar18 = uVar2;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 6);
      if (-1 < (int)uVar18) {
        do {
          iVar8 = select(uVar18 + 1,(fd_set *)__readfds,(fd_set *)0x0,(fd_set *)0x0,__timeout);
          if (-1 < iVar8) break;
          piVar10 = __errno_location();
        } while (*piVar10 == 4);
        bVar20 = iVar8 == 0;
        if (bVar20) {
          bVar5 = true;
        }
        if (iVar8 < 0) {
          piVar10 = __errno_location();
          pcVar12 = strerror(*piVar10);
          strncpy(cp->ErrorMessage,pcVar12,0x400);
          cmsysProcess_Kill(cp);
          cp->Killed = 0;
          cp->SelectError = 1;
          bVar20 = false;
          bVar5 = bVar3;
        }
      }
    }
LAB_005c734c:
    bVar3 = bVar5;
    iVar8 = (int)ptVar17;
  } while (!bVar20);
  if (userTimeout != (double *)0x0) {
    clock_gettime(1,(timespec *)&local_130);
    lVar15 = (long)local_130.__val[1] / 1000 + local_188;
    lVar19 = local_188 + 1000000 + (long)local_130.__val[1] / 1000;
    if (-1 < lVar15) {
      lVar19 = lVar15;
    }
    dVar1 = *userTimeout -
            ((double)lVar19 * 1e-06 +
            (double)(long)((lVar15 >> 0x3f) + (local_130.__val[0] - local_190)));
    dVar21 = 0.0;
    if (0.0 <= dVar1) {
      dVar21 = dVar1;
    }
    *userTimeout = dVar21;
  }
  if (iVar8 == 0) {
    iVar8 = 0xff;
    if (!bVar3) {
      iVar8 = 0;
    }
    if (!bVar4 && bVar3) {
      cmsysProcess_Kill(cp);
      cp->Killed = 0;
      cp->TimeoutExpired = 1;
      iVar8 = 0;
    }
  }
  return iVar8;
}

Assistant:

int kwsysProcess_WaitForData(kwsysProcess* cp, char** data, int* length,
                             double* userTimeout)
{
  kwsysProcessTime userStartTime = { 0, 0 };
  kwsysProcessWaitData wd = { 0, kwsysProcess_Pipe_None, 0, 0, { 0, 0 } };
  wd.UserTimeout = userTimeout;
  /* Make sure we are executing a process.  */
  if (!cp || cp->State != kwsysProcess_State_Executing || cp->Killed ||
      cp->TimeoutExpired) {
    return kwsysProcess_Pipe_None;
  }

  /* Record the time at which user timeout period starts.  */
  if (userTimeout) {
    userStartTime = kwsysProcessTimeGetCurrent();
  }

  /* Calculate the time at which a timeout will expire, and whether it
     is the user or process timeout.  */
  wd.User = kwsysProcessGetTimeoutTime(cp, userTimeout, &wd.TimeoutTime);

  /* Data can only be available when pipes are open.  If the process
     is not running, cp->PipesLeft will be 0.  */
  while (cp->PipesLeft > 0 &&
         !kwsysProcessWaitForPipe(cp, data, length, &wd)) {
  }

  /* Update the user timeout.  */
  if (userTimeout) {
    kwsysProcessTime userEndTime = kwsysProcessTimeGetCurrent();
    kwsysProcessTime difference =
      kwsysProcessTimeSubtract(userEndTime, userStartTime);
    double d = kwsysProcessTimeToDouble(difference);
    *userTimeout -= d;
    if (*userTimeout < 0) {
      *userTimeout = 0;
    }
  }

  /* Check what happened.  */
  if (wd.PipeId) {
    /* Data are ready on a pipe.  */
    return wd.PipeId;
  }
  if (wd.Expired) {
    /* A timeout has expired.  */
    if (wd.User) {
      /* The user timeout has expired.  It has no time left.  */
      return kwsysProcess_Pipe_Timeout;
    }

    /* The process timeout has expired.  Kill the children now.  */
    kwsysProcess_Kill(cp);
    cp->Killed = 0;
    cp->TimeoutExpired = 1;
    return kwsysProcess_Pipe_None;
  }
  /* No pipes are left open.  */
  return kwsysProcess_Pipe_None;
}